

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavesplit.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *__s;
  CommandOptions local_180 [3];
  CommandOptions local_118 [3];
  undefined4 local_b0;
  undefined1 local_a0 [8];
  CommandOptions Options;
  Result_t result;
  char **argv_local;
  int argc_local;
  
  Kumu::Result_t::Result_t((Result_t *)&Options.filename,(Result_t *)Kumu::RESULT_OK);
  CommandOptions::CommandOptions((CommandOptions *)local_a0,argc,argv);
  if ((local_a0[4] & 1U) == 0) {
    if ((local_a0[0] & 1U) == 0) {
      if ((local_a0[3] & 1U) != 0) {
        banner((FILE *)_stderr);
      }
      if ((local_a0[2] & 1U) == 0) {
        if ((local_a0[1] & 1U) != 0) {
          split_wav_file(local_180);
          Kumu::Result_t::operator=((Result_t *)&Options.filename,(Result_t *)local_180);
          Kumu::Result_t::~Result_t((Result_t *)local_180);
        }
      }
      else {
        wav_file_info(local_118);
        Kumu::Result_t::operator=((Result_t *)&Options.filename,(Result_t *)local_118);
        Kumu::Result_t::~Result_t((Result_t *)local_118);
      }
      bVar1 = Kumu::Result_t::operator!=((Result_t *)&Options.filename,(Result_t *)Kumu::RESULT_OK);
      if (bVar1) {
        fputs("Program stopped on error.\n",_stderr);
        bVar1 = Kumu::Result_t::operator!=
                          ((Result_t *)&Options.filename,(Result_t *)Kumu::RESULT_FAIL);
        if (bVar1) {
          __s = Kumu::Result_t::operator_cast_to_char_((Result_t *)&Options.filename);
          fputs(__s,_stderr);
          fputc(10,_stderr);
        }
        argv_local._4_4_ = 1;
      }
      else {
        argv_local._4_4_ = 0;
      }
    }
    else {
      argv_local._4_4_ = 3;
    }
  }
  else {
    usage((FILE *)_stderr);
    argv_local._4_4_ = 0;
  }
  local_b0 = 1;
  Kumu::Result_t::~Result_t((Result_t *)&Options.filename);
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, const char** argv)
{
  Result_t result = RESULT_OK;
  CommandOptions Options(argc, argv);

  if ( Options.help_flag )
    {
      usage();
      return 0;
    }

  if ( Options.error_flag )
    return 3;

  if ( Options.version_flag )
    banner();

  if ( Options.info_flag )
    result = wav_file_info(Options);

  else if ( Options.create_flag )
    result = split_wav_file(Options);

  if ( result != RESULT_OK )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}